

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

fdb_status compactor_destroy_file(char *filename,fdb_config *config)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  avl_node *paVar5;
  ulong uVar6;
  DIR *__dirp;
  dirent *pdVar7;
  fdb_status fVar8;
  char dirname [1024];
  char prefix [1024];
  openfiles_elem_conflict query;
  char full_fname [1024];
  compactor_config local_1190;
  char local_1178 [1024];
  char local_d78 [1024];
  char local_978 [1296];
  avl_node local_468 [2];
  char local_438 [1032];
  
  sVar4 = strlen(filename);
  (filename + sVar4)[0] = '.';
  (filename + sVar4)[1] = '\0';
  strcpy(local_978,filename);
  local_1190.sleep_duration = config->compactor_sleep_duration;
  local_1190.num_threads = config->num_compactor_threads;
  local_1190.spawn_threads = config->enable_background_compactor;
  compactor_init(&local_1190);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  compactor_args.strcmp_len = sVar4 + 1;
  paVar5 = avl_search(&openfiles,local_468,_compactor_cmp);
  if (paVar5 == (avl_node *)0x0) {
    compactor_args.strcmp_len = 0x400;
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    filename[sVar4] = '\0';
    sVar4 = strlen(filename);
    uVar6 = sVar4 & 0xffffffff;
    do {
      if ((int)uVar6 < 1) {
        local_1178[0] = '.';
        local_1178[1] = '\0';
        uVar6 = 0;
        goto LAB_0011f19b;
      }
      uVar1 = uVar6 - 1;
      lVar2 = uVar6 - 1;
      uVar6 = uVar1;
    } while (filename[lVar2] != '/');
    uVar6 = (ulong)((int)uVar1 + 1U & 0x7fffffff);
    strncpy(local_1178,filename,uVar6);
    local_1178[uVar6] = '\0';
LAB_0011f19b:
    strcpy(local_d78,filename + uVar6);
    sVar4 = strlen(local_d78);
    (local_d78 + sVar4)[0] = '.';
    (local_d78 + sVar4)[1] = '\0';
    __dirp = opendir(local_1178);
    if (__dirp == (DIR *)0x0) {
      fVar8 = FDB_RESULT_SUCCESS;
    }
    else {
      pdVar7 = readdir(__dirp);
      fVar8 = FDB_RESULT_SUCCESS;
      if (pdVar7 != (dirent *)0x0) {
        do {
          sVar4 = strlen(local_d78);
          iVar3 = strncmp(pdVar7->d_name,local_d78,sVar4);
          if (iVar3 == 0) {
            _reconstruct_path(local_438,local_1178,pdVar7->d_name);
            iVar3 = remove(local_438);
            if (iVar3 != 0) {
              fVar8 = FDB_RESULT_FILE_REMOVE_FAIL;
              break;
            }
          }
          pdVar7 = readdir(__dirp);
        } while (pdVar7 != (dirent *)0x0);
      }
      closedir(__dirp);
    }
  }
  else {
    fVar8 = FDB_RESULT_FILE_IS_BUSY;
    if (*(char *)((long)&paVar5[-1].left + 5) != '\0') {
      fVar8 = FDB_RESULT_IN_USE_BY_COMPACTOR;
    }
    compactor_args.strcmp_len = 0x400;
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    filename[sVar4] = '\0';
  }
  return fVar8;
}

Assistant:

fdb_status compactor_destroy_file(char *filename,
                                  fdb_config *config)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    size_t strcmp_len;
    fdb_status status = FDB_RESULT_SUCCESS;

    strcmp_len = strlen(filename);
    filename[strcmp_len] = '.'; // add a . suffix in place
    strcmp_len++;
    filename[strcmp_len] = '\0';
    strcpy(query.filename, filename);

    compactor_config c_config;
    c_config = *config;
    compactor_init(&c_config);

    mutex_lock(&cpt_lock);
    compactor_args.strcmp_len = strcmp_len; // Do prefix match for all vers
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        // if no handle refers this file
        if (elem->daemon_compact_in_progress) {
            // This file is waiting for compaction by compactor
            // Return a temporary failure, user must retry after sometime
            status = FDB_RESULT_IN_USE_BY_COMPACTOR;
        } else { // File handle not closed, fail operation
            status = FDB_RESULT_FILE_IS_BUSY;
        }
    }

    compactor_args.strcmp_len = MAX_FNAMELEN; // restore for normal compare
    mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as file
                             // deletions doesn't require strict synchronization.
    filename[strcmp_len - 1] = '\0'; // restore the filename
    if (status == FDB_RESULT_SUCCESS) {
        status = _compactor_search_n_destroy(filename);
    }

    return status;
}